

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::MedianFun::GetFunctions(void)

{
  long in_RDI;
  LogicalType local_1b0 [24];
  LogicalType local_198 [24];
  LogicalType local_180 [24];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  AggregateFunction local_148;
  
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"median","");
  duckdb::AggregateFunctionSet::AggregateFunctionSet();
  if (local_168[0] != local_158) {
    operator_delete(local_168[0]);
  }
  duckdb::LogicalType::LogicalType(local_180,ANY);
  duckdb::LogicalType::LogicalType(local_198,ANY);
  duckdb::LogicalType::LogicalType(local_1b0,INVALID);
  EmptyQuantileFunction<duckdb::MedianFunction>(&local_148,local_180,local_198,local_1b0);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (in_RDI + 0x20),&local_148);
  local_148._0_8_ = &PTR__AggregateFunction_00890e90;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_1b0);
  duckdb::LogicalType::~LogicalType(local_198);
  duckdb::LogicalType::~LogicalType(local_180);
  return;
}

Assistant:

AggregateFunctionSet MedianFun::GetFunctions() {
	AggregateFunctionSet set("median");
	set.AddFunction(EmptyQuantileFunction<MedianFunction>(LogicalType::ANY, LogicalType::ANY, LogicalTypeId::INVALID));
	return set;
}